

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_linear_resampler_get_heap_size
                    (ma_linear_resampler_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_linear_resampler_config *in_RSI;
  ma_linear_resampler_heap_layout heapLayout;
  ma_result result;
  undefined8 local_40;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  if (in_RSI == (ma_linear_resampler_config *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    in_RSI->format = ma_format_unknown;
    in_RSI->channels = 0;
    local_4 = ma_linear_resampler_get_heap_layout
                        (in_RSI,(ma_linear_resampler_heap_layout *)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (local_4 == MA_SUCCESS) {
      in_RSI->format = (undefined4)local_40;
      in_RSI->channels = local_40._4_4_;
      local_4 = MA_SUCCESS;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_linear_resampler_get_heap_size(const ma_linear_resampler_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_result result;
    ma_linear_resampler_heap_layout heapLayout;

    if (pHeapSizeInBytes == NULL) {
        return MA_INVALID_ARGS;
    }

    *pHeapSizeInBytes = 0;

    result = ma_linear_resampler_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pHeapSizeInBytes = heapLayout.sizeInBytes;

    return MA_SUCCESS;
}